

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O0

Var Js::JavascriptGeneratorFunction::NewInstanceRestrictedMode
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  ScriptContext *this;
  ThreadContext *this_00;
  Var *values;
  undefined4 *puVar3;
  Var pvVar4;
  undefined1 local_48 [8];
  ArgumentReader args;
  Var *_argsVarArray;
  ScriptContext *scriptContext;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  this = RecyclableObject::GetScriptContext(function);
  ScriptContext::CheckEvalRestriction(this);
  this_00 = ScriptContext::GetThreadContext(this);
  ThreadContext::ProbeStack(this_00,0xc00,this,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGeneratorFunction.cpp"
                                ,0x9e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)local_48,(CallInfo *)&function_local,values);
  pvVar4 = JavascriptFunction::NewInstanceHelper
                     (this,function,(CallInfo)function_local,(ArgumentReader *)local_48,Generator);
  return pvVar4;
}

Assistant:

Var JavascriptGeneratorFunction::NewInstanceRestrictedMode(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ScriptContext* scriptContext = function->GetScriptContext();

        scriptContext->CheckEvalRestriction();

        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);

        return JavascriptFunction::NewInstanceHelper(scriptContext, function, callInfo, args, FunctionKind::Generator);
    }